

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamFtp_p.cpp
# Opt level: O0

void __thiscall BamTools::Internal::BamFtp::ParseUrl(BamFtp *this,string *url)

{
  long lVar1;
  ulong uVar2;
  string *in_RSI;
  long in_RDI;
  string filename;
  string hostname;
  size_t firstSlashFound;
  size_t prefixFound;
  string tempUrl;
  string local_b8 [32];
  string local_98 [16];
  string *in_stack_ffffffffffffff78;
  string local_50 [32];
  string local_30 [48];
  
  *(undefined1 *)(in_RDI + 0x110) = 0;
  std::__cxx11::string::string(local_30,in_RSI);
  toLower(in_stack_ffffffffffffff78);
  std::__cxx11::string::~string(local_50);
  lVar1 = std::__cxx11::string::find(local_30,0x23b7f8);
  if (lVar1 != -1) {
    std::__cxx11::string::find((char)local_30,0x2f);
    std::__cxx11::string::substr((ulong)local_98,(ulong)local_30);
    std::__cxx11::string::operator=((string *)(in_RDI + 0x40),local_98);
    *(undefined2 *)(in_RDI + 0x60) = 0x15;
    std::__cxx11::string::substr((ulong)local_b8,(ulong)local_30);
    uVar2 = std::__cxx11::string::empty();
    if ((uVar2 & 1) == 0) {
      std::__cxx11::string::operator=((string *)(in_RDI + 0x90),local_b8);
      *(undefined1 *)(in_RDI + 0x110) = 1;
    }
    std::__cxx11::string::~string(local_b8);
    std::__cxx11::string::~string(local_98);
  }
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

void BamFtp::ParseUrl(const std::string& url)
{

    // clear flag to start
    m_isUrlParsed = false;

    // make sure url starts with "ftp://", case-insensitive
    std::string tempUrl(url);
    toLower(tempUrl);
    const std::size_t prefixFound = tempUrl.find(FTP_PREFIX);
    if (prefixFound == std::string::npos) return;

    // find end of host name portion (first '/' hit after the prefix)
    const std::size_t firstSlashFound = tempUrl.find(HOST_SEPARATOR, FTP_PREFIX_LENGTH);
    if (firstSlashFound == std::string::npos) {
        ;  // no slash found... no filename given along with host?
    }

    // fetch hostname
    std::string hostname = tempUrl.substr(FTP_PREFIX_LENGTH, (firstSlashFound - FTP_PREFIX_LENGTH));
    m_hostname = hostname;
    m_port = FTP_PORT;

    // store remainder of URL as filename (must be non-empty)
    std::string filename = tempUrl.substr(firstSlashFound);
    if (filename.empty()) return;
    m_filename = filename;

    // set parsed OK flag
    m_isUrlParsed = true;
}